

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.cpp
# Opt level: O1

int __thiscall
P_Alternation::match(P_Alternation *this,vector<StateP,_std::allocator<StateP>_> *stk)

{
  pointer pSVar1;
  P_Sequence *pPVar2;
  long lVar3;
  StateP sp;
  value_type vStack_88;
  
  pSVar1 = (stk->super__Vector_base<StateP,_std::allocator<StateP>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  Grid::Grid((Grid *)&vStack_88,(Grid *)(pSVar1 + -1));
  vStack_88.st.flags = pSVar1[-1].st.flags;
  vStack_88.st.direction = pSVar1[-1].st.direction;
  vStack_88.st.position = pSVar1[-1].st.position;
  std::vector<int,_std::allocator<int>_>::vector(&vStack_88.st.qcount,&pSVar1[-1].st.qcount);
  vStack_88.iseq = pSVar1[-1].iseq;
  vStack_88.seq = pSVar1[-1].seq;
  std::vector<StateP,_std::allocator<StateP>_>::pop_back(stk);
  lVar3 = (long)(this->v).super__Vector_base<P_Sequence_*,_std::allocator<P_Sequence_*>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->v).super__Vector_base<P_Sequence_*,_std::allocator<P_Sequence_*>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (lVar3 != 0) {
    lVar3 = lVar3 >> 3;
    do {
      std::vector<StateP,_std::allocator<StateP>_>::push_back(stk,&vStack_88);
      pPVar2 = (this->v).super__Vector_base<P_Sequence_*,_std::allocator<P_Sequence_*>_>._M_impl.
               super__Vector_impl_data._M_start[lVar3 + -1];
      pSVar1 = (stk->super__Vector_base<StateP,_std::allocator<StateP>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      pPVar2->parent = pSVar1[-1].seq;
      pPVar2->iparent = pSVar1[-1].iseq;
      pSVar1[-1].seq = pPVar2;
      pSVar1[-1].iseq = 0;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  if (vStack_88.st.qcount.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vStack_88.st.qcount.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  Grid::~Grid((Grid *)&vStack_88);
  return 0;
}

Assistant:

int P_Alternation::match(vector<StateP> &stk) {
    StateP sp = stk.back(); stk.pop_back();

    for (size_t i = v.size(); i--; ) {
        stk.push_back(sp);
        v[i]->match(stk);
    }
    return 0;
}